

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::BinaryExpression::fromComponents
          (BinaryExpression *this,Expression *lhs,Expression *rhs,BinaryOperator op,
          SourceLocation opLoc,SourceRange sourceRange,ASTContext *context)

{
  bool bVar1;
  Expression **ppEVar2;
  Type *pTVar3;
  logic_error *this_00;
  Diagnostic *diag_00;
  Diagnostic *diag_01;
  undefined4 in_register_0000000c;
  bool local_3b9;
  Type *local_388;
  Type *local_350;
  bool local_341;
  bool local_31b;
  bool local_31a;
  bool local_319;
  Diagnostic *diag;
  string local_2d8;
  allocator<char> local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  Type *local_200;
  Type *local_1f8;
  Type *local_1f0;
  Type *local_1e8;
  Type *local_1e0;
  Type *local_1d8;
  Type *local_1d0;
  Type *local_1c8;
  Type *local_1c0;
  Type *local_1b8;
  Type *local_1b0;
  Type *local_1a8;
  Type *local_1a0;
  Type *local_198;
  SourceLocation local_190;
  SourceLocation local_188;
  Type *local_180;
  Type *local_178;
  bool local_16a;
  byte local_169;
  bool isWildcard;
  SourceLocation SStack_168;
  bool isContext;
  SourceLocation local_160;
  Type *local_158;
  Type *nt_1;
  Type *local_148;
  Type *local_140;
  Type *local_138;
  Type *local_130;
  Type *local_128;
  Type *local_120;
  Type *local_118;
  SourceLocation local_110;
  SourceLocation local_108;
  Type *local_100;
  Type *nt;
  Type *local_f0;
  Type *local_e8;
  Type *local_e0;
  SourceLocation local_d8;
  Type *local_d0;
  Type *local_c8;
  Type *local_c0;
  Type *local_b8;
  Type *local_b0;
  Type *local_a8;
  Type *local_a0;
  Type *local_98;
  Type *local_90;
  Type *local_88;
  Type *local_80;
  Type *local_78;
  Type *local_70;
  bool local_66;
  anon_class_1_0_00000001 local_65;
  anon_class_1_0_00000001 local_64;
  bool local_63;
  bool local_62;
  bool local_61;
  bool good;
  anon_class_1_0_00000001 singleBitType;
  anon_class_1_0_00000001 forceFourState;
  bool bothStrings;
  bool bothNumeric;
  SourceLocation SStack_60;
  bool bothIntegral;
  BinaryExpression *result;
  Type *rt;
  Type *lt;
  Compilation *compilation;
  Expression *pEStack_38;
  BinaryOperator op_local;
  Expression *rhs_local;
  Expression *lhs_local;
  SourceRange sourceRange_local;
  SourceLocation opLoc_local;
  
  sourceRange_local.endLoc._4_4_ = in_register_0000000c;
  sourceRange_local.endLoc._0_4_ = op;
  compilation._4_4_ = (int)rhs;
  pEStack_38 = lhs;
  rhs_local = &this->super_Expression;
  lhs_local = (Expression *)opLoc;
  sourceRange_local.startLoc = (SourceLocation)context;
  lt = (Type *)ASTContext::getCompilation((ASTContext *)sourceRange.startLoc);
  rt = not_null::operator_cast_to_Type_((not_null *)&rhs_local->type);
  result = (BinaryExpression *)not_null::operator_cast_to_Type_((not_null *)&pEStack_38->type);
  SStack_60 = (SourceLocation)
              BumpAllocator::
              emplace<slang::ast::BinaryExpression,slang::ast::BinaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                        ((BumpAllocator *)lt,(BinaryOperator *)((long)&compilation + 4),rt,rhs_local
                         ,pEStack_38,(SourceRange *)&lhs_local);
  bVar1 = Expression::bad(rhs_local);
  if ((bVar1) || (bVar1 = Expression::bad(pEStack_38), bVar1)) {
    opLoc_local = (SourceLocation)Expression::badExpr((Compilation *)lt,(Expression *)SStack_60);
  }
  else {
    bVar1 = Type::isUnbounded(rt);
    if (bVar1) {
      rt = Compilation::getIntType((Compilation *)lt);
    }
    bVar1 = Type::isUnbounded((Type *)result);
    if (bVar1) {
      result = (BinaryExpression *)Compilation::getIntType((Compilation *)lt);
    }
    bVar1 = Type::isIntegral(rt);
    local_319 = false;
    if (bVar1) {
      local_319 = Type::isIntegral((Type *)result);
    }
    local_61 = local_319;
    bVar1 = Type::isNumeric(rt);
    local_31a = false;
    if (bVar1) {
      local_31a = Type::isNumeric((Type *)result);
    }
    local_62 = local_31a;
    bVar1 = Expression::isImplicitString(rhs_local);
    local_31b = false;
    if (bVar1) {
      local_31b = Expression::isImplicitString(pEStack_38);
    }
    local_63 = local_31b;
    switch(compilation._4_4_) {
    case 0:
    case 1:
    case 2:
      local_66 = (bool)(local_62 & 1);
      local_78 = Expression::binaryOperatorType((Compilation *)lt,rt,(Type *)result,false,false);
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_70,&local_78);
      ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_70;
      break;
    case 3:
      local_66 = (bool)(local_62 & 1);
      local_88 = Expression::binaryOperatorType((Compilation *)lt,rt,(Type *)result,true,false);
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_80,&local_88);
      ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_80;
      break;
    case 4:
      local_66 = (bool)(local_61 & 1);
      local_98 = Expression::binaryOperatorType((Compilation *)lt,rt,(Type *)result,true,false);
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_90,&local_98);
      ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_90;
      break;
    case 5:
    case 6:
    case 7:
    case 8:
      local_66 = (bool)(local_61 & 1);
      local_a8 = Expression::binaryOperatorType((Compilation *)lt,rt,(Type *)result,false,false);
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_a0,&local_a8);
      ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_a0;
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0x11:
    case 0x12:
      if ((local_62 & 1U) == 0) {
        local_169 = 0;
        local_3b9 = compilation._4_4_ == 0x11 || compilation._4_4_ == 0x12;
        local_16a = local_3b9;
        if (local_31b == false) {
          bVar1 = Type::isAggregate(rt);
          if (((!bVar1) || (bVar1 = Type::isEquivalent(rt,(Type *)result), !bVar1)) ||
             (bVar1 = Type::isUnpackedUnion(rt), bVar1)) {
            bVar1 = Type::isClass(rt);
            if (((bVar1) && (bVar1 = Type::isAssignmentCompatible(rt,(Type *)result), bVar1)) ||
               ((bVar1 = Type::isClass((Type *)result), bVar1 &&
                (bVar1 = Type::isAssignmentCompatible((Type *)result,rt), bVar1)))) {
              local_66 = true;
              local_1b0 = Compilation::getBitType((Compilation *)lt);
              not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                        ((not_null<slang::ast::Type_const*> *)&local_1a8,&local_1b0);
              ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_1a8;
            }
            else {
              bVar1 = Type::isCHandle(rt);
              if (((bVar1) || (bVar1 = Type::isNull(rt), bVar1)) &&
                 ((bVar1 = Type::isCHandle((Type *)result), bVar1 ||
                  (bVar1 = Type::isNull((Type *)result), bVar1)))) {
                local_66 = true;
                local_1c0 = Compilation::getBitType((Compilation *)lt);
                not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                          ((not_null<slang::ast::Type_const*> *)&local_1b8,&local_1c0);
                ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_1b8;
              }
              else {
                bVar1 = Type::isEvent(rt);
                if (((bVar1) || (bVar1 = Type::isNull(rt), bVar1)) &&
                   ((bVar1 = Type::isEvent((Type *)result), bVar1 ||
                    (bVar1 = Type::isNull((Type *)result), bVar1)))) {
                  local_66 = true;
                  local_1d0 = Compilation::getBitType((Compilation *)lt);
                  not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                            ((not_null<slang::ast::Type_const*> *)&local_1c8,&local_1d0);
                  ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_1c8;
                }
                else {
                  bVar1 = Type::isCovergroup(rt);
                  if (((bVar1) || (bVar1 = Type::isNull(rt), bVar1)) &&
                     ((bVar1 = Type::isCovergroup((Type *)result), bVar1 ||
                      (bVar1 = Type::isNull((Type *)result), bVar1)))) {
                    local_66 = true;
                    local_1e0 = Compilation::getBitType((Compilation *)lt);
                    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                              ((not_null<slang::ast::Type_const*> *)&local_1d8,&local_1e0);
                    ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_1d8;
                  }
                  else {
                    bVar1 = Type::isVirtualInterface(rt);
                    if (((bVar1) && (bVar1 = Type::isAssignmentCompatible(rt,(Type *)result), bVar1)
                        ) || ((bVar1 = Type::isVirtualInterface((Type *)result), bVar1 &&
                              (bVar1 = Type::isAssignmentCompatible((Type *)result,rt), bVar1)))) {
                      local_66 = true;
                      local_1f0 = Compilation::getBitType((Compilation *)lt);
                      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                                ((not_null<slang::ast::Type_const*> *)&local_1e8,&local_1f0);
                      ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_1e8
                      ;
                    }
                    else {
                      bVar1 = Type::isTypeRefType(rt);
                      if ((bVar1) && (bVar1 = Type::isTypeRefType((Type *)result), bVar1)) {
                        local_66 = (bool)((local_16a ^ 0xffU) & 1);
                        local_200 = Compilation::getBitType((Compilation *)lt);
                        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                                  ((not_null<slang::ast::Type_const*> *)&local_1f8,&local_200);
                        ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr =
                             local_1f8;
                      }
                      else {
                        local_66 = false;
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            local_66 = (bool)((local_16a ^ 0xffU) & 1);
            local_1a0 = fromComponents::anon_class_1_0_00000001::operator()
                                  (&local_65,(Compilation *)lt,rt,(Type *)result);
            not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                      ((not_null<slang::ast::Type_const*> *)&local_198,&local_1a0);
            ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_198;
          }
        }
        else {
          local_66 = (bool)((local_3b9 ^ 0xffU) & 1);
          local_180 = Compilation::getBitType((Compilation *)lt);
          not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                    ((not_null<slang::ast::Type_const*> *)&local_178,&local_180);
          ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_178;
          local_169 = 1;
          ppEVar2 = (Expression **)((long)SStack_60 + 0x38);
          pTVar3 = Compilation::getStringType((Compilation *)lt);
          SourceLocation::SourceLocation(&local_188);
          Expression::contextDetermined((ASTContext *)sourceRange.startLoc,ppEVar2,pTVar3,local_188)
          ;
          ppEVar2 = (Expression **)((long)SStack_60 + 0x40);
          pTVar3 = Compilation::getStringType((Compilation *)lt);
          SourceLocation::SourceLocation(&local_190);
          Expression::contextDetermined((ASTContext *)sourceRange.startLoc,ppEVar2,pTVar3,local_190)
          ;
        }
        if ((local_169 & 1) == 0) {
          Expression::selfDetermined
                    ((ASTContext *)sourceRange.startLoc,(Expression **)((long)SStack_60 + 0x38));
          Expression::selfDetermined
                    ((ASTContext *)sourceRange.startLoc,(Expression **)((long)SStack_60 + 0x40));
        }
      }
      else {
        if ((compilation._4_4_ == 9) || (compilation._4_4_ == 10)) {
          local_66 = true;
          local_130 = fromComponents::anon_class_1_0_00000001::operator()
                                (&local_65,(Compilation *)lt,rt,(Type *)result);
          not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                    ((not_null<slang::ast::Type_const*> *)&local_128,&local_130);
          ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_128;
        }
        else if ((compilation._4_4_ == 0xb) || (compilation._4_4_ == 0xc)) {
          local_66 = true;
          local_140 = Compilation::getBitType((Compilation *)lt);
          not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                    ((not_null<slang::ast::Type_const*> *)&local_138,&local_140);
          ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_138;
        }
        else {
          local_66 = (bool)(local_61 & 1);
          bVar1 = Type::isFourState(rt);
          if (bVar1) {
            local_388 = Compilation::getLogicType((Compilation *)lt);
          }
          else {
            local_388 = Compilation::getBitType((Compilation *)lt);
          }
          nt_1 = local_388;
          not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                    ((not_null<slang::ast::Type_const*> *)&local_148,&nt_1);
          ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_148;
        }
        pTVar3 = Expression::binaryOperatorType((Compilation *)lt,rt,(Type *)result,false,false);
        ppEVar2 = (Expression **)((long)SStack_60 + 0x38);
        local_158 = pTVar3;
        SourceLocation::SourceLocation(&local_160);
        Expression::contextDetermined((ASTContext *)sourceRange.startLoc,ppEVar2,pTVar3,local_160);
        pTVar3 = local_158;
        ppEVar2 = (Expression **)((long)SStack_60 + 0x40);
        SourceLocation::SourceLocation(&stack0xfffffffffffffe98);
        Expression::contextDetermined((ASTContext *)sourceRange.startLoc,ppEVar2,pTVar3,SStack_168);
      }
      break;
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
      local_341 = true;
      if ((local_62 & 1U) == 0) {
        local_341 = local_31b;
      }
      local_66 = local_341;
      nt = fromComponents::anon_class_1_0_00000001::operator()
                     (&local_65,(Compilation *)lt,rt,(Type *)result);
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_f0,&nt);
      ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_f0;
      if (((local_66 & 1U) == 0) || ((local_62 & 1U) != 0)) {
        local_350 = Expression::binaryOperatorType((Compilation *)lt,rt,(Type *)result,false,false);
      }
      else {
        local_350 = Compilation::getStringType((Compilation *)lt);
      }
      local_100 = local_350;
      ppEVar2 = (Expression **)((long)SStack_60 + 0x38);
      SourceLocation::SourceLocation(&local_108);
      Expression::contextDetermined((ASTContext *)sourceRange.startLoc,ppEVar2,local_350,local_108);
      pTVar3 = local_100;
      ppEVar2 = (Expression **)((long)SStack_60 + 0x40);
      SourceLocation::SourceLocation(&local_110);
      Expression::contextDetermined((ASTContext *)sourceRange.startLoc,ppEVar2,pTVar3,local_110);
      break;
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
      local_66 = (bool)(local_62 & 1);
      local_120 = fromComponents::anon_class_1_0_00000001::operator()
                            (&local_65,(Compilation *)lt,rt,(Type *)result);
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_118,&local_120);
      ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_118;
      Expression::selfDetermined
                ((ASTContext *)sourceRange.startLoc,(Expression **)((long)SStack_60 + 0x38));
      Expression::selfDetermined
                ((ASTContext *)sourceRange.startLoc,(Expression **)((long)SStack_60 + 0x40));
      break;
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
      local_66 = (bool)(local_61 & 1);
      bVar1 = Type::isFourState((Type *)result);
      if (bVar1) {
        local_b8 = fromComponents::anon_class_1_0_00000001::operator()
                             (&local_64,(Compilation *)lt,rt);
        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                  ((not_null<slang::ast::Type_const*> *)&local_b0,&local_b8);
        ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_b0;
      }
      else {
        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                  ((not_null<slang::ast::Type_const*> *)&local_c0,&rt);
        ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_c0;
      }
      Expression::selfDetermined
                ((ASTContext *)sourceRange.startLoc,(Expression **)((long)SStack_60 + 0x40));
      break;
    case 0x1b:
      local_66 = (bool)(local_62 & 1);
      bVar1 = Type::isFloating(rt);
      if ((bVar1) || (bVar1 = Type::isFloating((Type *)result), bVar1)) {
        local_d0 = Expression::binaryOperatorType((Compilation *)lt,rt,(Type *)result,false,false);
        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                  ((not_null<slang::ast::Type_const*> *)&local_c8,&local_d0);
        ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_c8;
        ppEVar2 = (Expression **)((long)SStack_60 + 0x40);
        pTVar3 = not_null<const_slang::ast::Type_*>::operator*
                           ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8));
        SourceLocation::SourceLocation(&local_d8);
        Expression::contextDetermined((ASTContext *)sourceRange.startLoc,ppEVar2,pTVar3,local_d8);
      }
      else {
        local_e8 = fromComponents::anon_class_1_0_00000001::operator()
                             (&local_64,(Compilation *)lt,rt);
        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                  ((not_null<slang::ast::Type_const*> *)&local_e0,&local_e8);
        ((not_null<const_slang::ast::Type_*> *)((long)SStack_60 + 8))->ptr = local_e0;
        Expression::selfDetermined
                  ((ASTContext *)sourceRange.startLoc,(Expression **)((long)SStack_60 + 0x40));
      }
      break;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
                 ,&local_2a1);
      std::operator+(&local_280,&local_2a0,":");
      std::__cxx11::to_string(&local_2d8,0x322);
      std::operator+(&local_260,&local_280,&local_2d8);
      std::operator+(&local_240,&local_260,": ");
      std::operator+(&local_220,&local_240,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_220);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if ((local_66 & 1U) == 0) {
      diag_00 = ASTContext::addDiag((ASTContext *)sourceRange.startLoc,(DiagCode)0x1d0007,
                                    sourceRange_local.endLoc);
      diag_01 = ast::operator<<(diag_00,rt);
      ast::operator<<(diag_01,(Type *)result);
      Diagnostic::operator<<(diag_00,rhs_local->sourceRange);
      Diagnostic::operator<<(diag_00,pEStack_38->sourceRange);
      opLoc_local = (SourceLocation)Expression::badExpr((Compilation *)lt,(Expression *)SStack_60);
    }
    else {
      opLoc_local = SStack_60;
    }
  }
  return (Expression *)opLoc_local;
}

Assistant:

Expression& BinaryExpression::fromComponents(Expression& lhs, Expression& rhs, BinaryOperator op,
                                             SourceLocation opLoc, SourceRange sourceRange,
                                             const ASTContext& context) {
    auto& compilation = context.getCompilation();
    const Type* lt = lhs.type;
    const Type* rt = rhs.type;

    auto result = compilation.emplace<BinaryExpression>(op, *lt, lhs, rhs, sourceRange);
    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lt->isUnbounded())
        lt = &compilation.getIntType();
    if (rt->isUnbounded())
        rt = &compilation.getIntType();

    bool bothIntegral = lt->isIntegral() && rt->isIntegral();
    bool bothNumeric = lt->isNumeric() && rt->isNumeric();
    bool bothStrings = lhs.isImplicitString() && rhs.isImplicitString();

    auto forceFourState = [](Compilation& compilation, const Type* forceType) {
        if (forceType->isFloating() || forceType->isFourState())
            return forceType;

        // Use the logic in binaryOperatorType to create a type with the correct size and sign.
        return binaryOperatorType(compilation, forceType, forceType, true);
    };

    auto singleBitType = [](Compilation& compilation, const Type* lt, const Type* rt) {
        if (lt->isFourState() || rt->isFourState())
            return &compilation.getLogicType();
        return &compilation.getBitType();
    };

    bool good;
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
            good = bothNumeric;
            result->type = binaryOperatorType(compilation, lt, rt, false);
            break;
        case BinaryOperator::Divide:
            // Result is forced to 4-state because result can be X.
            good = bothNumeric;
            result->type = binaryOperatorType(compilation, lt, rt, true);
            break;
        case BinaryOperator::Mod:
            // Result is forced to 4-state because result can be X.
            // Different from divide because only integers are allowed.
            good = bothIntegral;
            result->type = binaryOperatorType(compilation, lt, rt, true);
            break;
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            good = bothIntegral;
            result->type = binaryOperatorType(compilation, lt, rt, false);
            break;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
            // The result is always the same type as the lhs, except that if the rhs is
            // four state then the lhs also becomes four state.
            good = bothIntegral;
            if (rt->isFourState())
                result->type = forceFourState(compilation, lt);
            else
                result->type = lt;
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Power:
            good = bothNumeric;
            if (lt->isFloating() || rt->isFloating()) {
                result->type = binaryOperatorType(compilation, lt, rt, false);
                contextDetermined(context, result->right_, *result->type);
            }
            else {
                // Result is forced to 4-state because result can be X.
                result->type = forceFourState(compilation, lt);
                selfDetermined(context, result->right_);
            }
            break;
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan: {
            // Result is always a single bit.
            good = bothNumeric || bothStrings;
            result->type = singleBitType(compilation, lt, rt);

            // Result type is fixed but the two operands affect each other as they would in
            // other context-determined operators.
            auto nt = (good && !bothNumeric) ? &compilation.getStringType()
                                             : binaryOperatorType(compilation, lt, rt, false);
            contextDetermined(context, result->left_, *nt);
            contextDetermined(context, result->right_, *nt);
            break;
        }
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            // Result is always a single bit.
            good = bothNumeric;
            result->type = singleBitType(compilation, lt, rt);
            selfDetermined(context, result->left_);
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
            // Two types are comparable if:
            // - they are both integral or floating
            // - both classes or null, and assignment compatible
            // - both chandles or null
            // - both aggregates and equivalent
            if (bothNumeric) {
                // For equality and inequality, result is four state if either operand is
                // four state. For case equality and case inequality, result is never four
                // state. For wildcard equality / inequality, result is four state only if
                // lhs is four state.
                if (op == BinaryOperator::Equality || op == BinaryOperator::Inequality) {
                    good = true;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if (op == BinaryOperator::CaseEquality ||
                         op == BinaryOperator::CaseInequality) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = bothIntegral;
                    result->type = lt->isFourState() ? &compilation.getLogicType()
                                                     : &compilation.getBitType();
                }

                // Result type is fixed but the two operands affect each other as they would
                // in other context-determined operators.
                auto nt = binaryOperatorType(compilation, lt, rt, false);
                contextDetermined(context, result->left_, *nt);
                contextDetermined(context, result->right_, *nt);
            }
            else {
                bool isContext = false;
                bool isWildcard = op == BinaryOperator::WildcardEquality ||
                                  op == BinaryOperator::WildcardInequality;

                if (bothStrings) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();

                    // If there is a literal involved, make sure it's converted to string.
                    isContext = true;
                    contextDetermined(context, result->left_, compilation.getStringType());
                    contextDetermined(context, result->right_, compilation.getStringType());
                }
                else if (lt->isAggregate() && lt->isEquivalent(*rt) && !lt->isUnpackedUnion()) {
                    good = !isWildcard;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if ((lt->isClass() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isClass() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCHandle() || lt->isNull()) && (rt->isCHandle() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isEvent() || lt->isNull()) && (rt->isEvent() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCovergroup() || lt->isNull()) &&
                         (rt->isCovergroup() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isVirtualInterface() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isVirtualInterface() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if (lt->isTypeRefType() && rt->isTypeRefType()) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = false;
                }

                if (!isContext) {
                    selfDetermined(context, result->left_);
                    selfDetermined(context, result->right_);
                }
            }
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadBinaryExpression, opLoc);
        diag << *lt << *rt;
        diag << lhs.sourceRange;
        diag << rhs.sourceRange;
        return badExpr(compilation, result);
    }

    return *result;
}